

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O0

void __thiscall mir::types::PtrTy::reduce_array(PtrTy *this)

{
  int iVar1;
  element_type *peVar2;
  shared_ptr<mir::types::Ty> *in_RDI;
  shared_ptr<mir::types::ArrayTy> arr;
  shared_ptr<mir::types::Ty> *in_stack_ffffffffffffffd8;
  shared_ptr<mir::types::Ty> *__r;
  
  __r = in_RDI;
  peVar2 = std::__shared_ptr_access<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2bee8c);
  iVar1 = (*(peVar2->super_Displayable)._vptr_Displayable[1])();
  if (iVar1 == 2) {
    std::dynamic_pointer_cast<mir::types::ArrayTy,mir::types::Ty>(__r);
    std::__shared_ptr_access<mir::types::ArrayTy,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<mir::types::ArrayTy,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x2beeb7);
    std::shared_ptr<mir::types::Ty>::operator=(in_RDI,in_stack_ffffffffffffffd8);
    std::shared_ptr<mir::types::ArrayTy>::~shared_ptr((shared_ptr<mir::types::ArrayTy> *)0x2beed6);
  }
  return;
}

Assistant:

void PtrTy::reduce_array() {
  if (this->item->kind() == TyKind::Array) {
    auto arr = std::dynamic_pointer_cast<ArrayTy>(this->item);
    this->item = arr->item;
  }
  // else noop
}